

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_min,void *p_max,
                        char *format,ImGuiSliderFlags flags)

{
  bool bVar1;
  int iVar2;
  ImGuiWindowTempData *min;
  ImGuiDataTypeInfo *pIVar3;
  char *in_RCX;
  void *in_RDX;
  ImGuiDataType in_ESI;
  ImRect *in_RDI;
  void *in_R8;
  char *in_R9;
  float fVar4;
  uint in_stack_00000008;
  char *value_buf_end;
  char value_buf [64];
  bool value_changed;
  ImRect grab_bb;
  ImU32 frame_col;
  bool is_clamp_input;
  bool clicked;
  bool focus_requested;
  bool temp_input_is_active;
  bool temp_input_allowed;
  bool hovered;
  ImRect total_bb;
  ImRect frame_bb;
  ImVec2 label_size;
  float w;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffde8;
  char *pcVar5;
  ImRect *in_stack_fffffffffffffdf0;
  undefined8 uVar6;
  ImRect *in_stack_fffffffffffffdf8;
  ImVec2 *pIVar7;
  float in_stack_fffffffffffffe00;
  ImGuiID in_stack_fffffffffffffe04;
  ImGuiWindow *in_stack_fffffffffffffe08;
  ImVec2 *pIVar8;
  ImGuiWindow *in_stack_fffffffffffffe10;
  ImGuiWindow *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  ImGuiID id_00;
  void *in_stack_fffffffffffffe28;
  undefined1 hide_text_after_hash;
  ImDrawList *in_stack_fffffffffffffe30;
  ImVec2 *in_stack_fffffffffffffe38;
  ImVec2 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  float fVar9;
  ImRect *in_stack_fffffffffffffe50;
  ImVec2 in_stack_fffffffffffffe58;
  ImVec2 in_stack_fffffffffffffe60;
  ImGuiSliderFlags in_stack_fffffffffffffe68;
  ImRect *in_stack_fffffffffffffe70;
  byte local_16b;
  bool local_16a;
  bool local_169;
  undefined4 in_stack_fffffffffffffea0;
  ImVec2 local_130;
  ImVec2 local_128;
  char *local_120;
  ImVec2 local_118 [8];
  byte local_d1;
  ImVec2 local_d0;
  float local_c8 [7];
  ImU32 local_ac;
  undefined1 local_a6;
  byte local_a5;
  bool local_a4;
  bool local_a3;
  byte local_a2;
  byte local_a1;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImRect local_90;
  ImVec2 local_80;
  ImVec2 local_78;
  ImRect local_70;
  ImVec2 local_60;
  float local_58;
  ImGuiID local_54;
  ImGuiStyle *local_50;
  ImGuiContext *local_48;
  ImGuiWindow *local_40;
  char *local_38;
  void *local_30;
  char *local_28;
  void *local_20;
  ImGuiDataType local_14;
  ImRect *local_10;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_40 = GetCurrentWindow();
  if ((local_40->SkipItems & 1U) == 0) {
    local_48 = GImGui;
    local_50 = &GImGui->Style;
    local_54 = ImGuiWindow::GetID(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,
                                  (char *)CONCAT44(in_stack_fffffffffffffe04,
                                                   in_stack_fffffffffffffe00));
    local_58 = CalcItemWidth();
    local_60 = CalcTextSize((char *)in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10,
                            SUB81((ulong)in_stack_fffffffffffffe08 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe08,0));
    min = &local_40->DC;
    fVar4 = (local_50->FramePadding).y;
    ImVec2::ImVec2(&local_80,local_58,fVar4 + fVar4 + local_60.y);
    local_78 = operator+(in_stack_fffffffffffffde8,(ImVec2 *)0x193f88);
    ImRect::ImRect(&local_70,&min->CursorPos,&local_78);
    if (local_60.x <= 0.0) {
      fVar4 = 0.0;
    }
    else {
      fVar4 = (local_50->ItemInnerSpacing).x + local_60.x;
    }
    pIVar7 = &local_a0;
    ImVec2::ImVec2(pIVar7,fVar4,0.0);
    local_98 = operator+(in_stack_fffffffffffffde8,(ImVec2 *)0x194048);
    fVar9 = (float)((ulong)in_stack_fffffffffffffde8 >> 0x20);
    ImRect::ImRect(&local_90,&local_70.Min,&local_98);
    ItemSize(in_stack_fffffffffffffdf0,fVar9);
    bVar1 = ItemAdd((ImRect *)in_stack_fffffffffffffe18,
                    (ImGuiID)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                    (ImRect *)in_stack_fffffffffffffe08);
    if (bVar1) {
      if (local_38 == (char *)0x0) {
        pIVar3 = DataTypeGetInfo(local_14);
        local_38 = pIVar3->PrintFmt;
      }
      else if ((local_14 == 4) && (iVar2 = strcmp(local_38,"%d"), iVar2 != 0)) {
        local_38 = PatchFormatStringFloatToInt((char *)in_stack_fffffffffffffdf8);
      }
      local_a1 = ItemHoverable(in_stack_fffffffffffffdf8,
                               (ImGuiID)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
      local_a2 = (in_stack_00000008 & 0x80) == 0;
      local_169 = false;
      if ((bool)local_a2) {
        local_169 = TempInputIsActive(local_54);
      }
      local_a3 = local_169;
      if (local_169 == false) {
        local_16a = false;
        if ((local_a2 & 1) != 0) {
          local_16a = FocusableItemRegister(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04);
        }
        local_a4 = local_16a;
        local_16b = 0;
        if ((local_a1 & 1) != 0) {
          local_16b = (local_48->IO).MouseClicked[0];
        }
        local_a5 = local_16b & 1;
        if ((((local_16a != false) || (local_a5 != 0)) || (local_48->NavActivateId == local_54)) ||
           (local_48->NavInputId == local_54)) {
          SetActiveID(local_54,local_40);
          SetFocusID(id_00,in_stack_fffffffffffffe18);
          FocusWindow(in_stack_fffffffffffffe10);
          local_48->ActiveIdUsingNavDirMask = local_48->ActiveIdUsingNavDirMask | 3;
          if (((local_a2 & 1) != 0) &&
             ((((local_a4 & 1U) != 0 ||
               (((local_a5 & 1) != 0 && (((local_48->IO).KeyCtrl & 1U) != 0)))) ||
              (local_48->NavInputId == local_54)))) {
            local_a3 = true;
            FocusableItemUnregister(local_40);
          }
        }
      }
      if ((local_a3 & 1U) == 0) {
        if (local_48->ActiveId == local_54) {
          fVar9 = 1.26117e-44;
        }
        else {
          fVar9 = 9.80909e-45;
          if (local_48->HoveredId == local_54) {
            fVar9 = 1.12104e-44;
          }
        }
        local_ac = GetColorU32(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
        RenderNavHighlight((ImRect *)CONCAT44(fVar4,in_stack_fffffffffffffea0),
                           (ImGuiID)((ulong)pIVar7 >> 0x20),(ImGuiNavHighlightFlags)pIVar7);
        RenderFrame(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                    (ImU32)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                    SUB81((ulong)in_stack_fffffffffffffe50 >> 0x18,0),fVar9);
        ImRect::ImRect(in_stack_fffffffffffffdf0);
        pIVar7 = &local_d0;
        uVar6 = CONCAT44((int)((ulong)in_stack_fffffffffffffdf0 >> 0x20),in_stack_00000008);
        pcVar5 = local_38;
        local_d1 = SliderBehavior((ImRect *)CONCAT44(fVar9,in_stack_fffffffffffffe48),
                                  (ImGuiID)in_stack_fffffffffffffe40.y,
                                  (ImGuiDataType)in_stack_fffffffffffffe40.x,
                                  in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                                  in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe60,
                                  in_stack_fffffffffffffe68,in_stack_fffffffffffffe70);
        if ((bool)local_d1) {
          MarkItemEdited(local_54);
        }
        if (local_d0.x < local_c8[0]) {
          in_stack_fffffffffffffe30 = local_40->DrawList;
          in_stack_fffffffffffffe38 = &local_d0;
          in_stack_fffffffffffffe40 = (ImVec2)local_c8;
          GetColorU32(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00);
          ImDrawList::AddRectFilled
                    ((ImDrawList *)in_stack_fffffffffffffe10,(ImVec2 *)in_stack_fffffffffffffe08,
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (ImU32)((ulong)pIVar7 >> 0x20),SUB84(pIVar7,0),
                     (ImDrawCornerFlags)((ulong)uVar6 >> 0x20));
        }
        pIVar8 = local_118;
        iVar2 = DataTypeFormatString
                          ((char *)pIVar7,(int)((ulong)uVar6 >> 0x20),(ImGuiDataType)uVar6,pcVar5,
                           (char *)0x194638);
        pcVar5 = (char *)((long)&pIVar8->x + (long)iVar2);
        pIVar8 = &local_70.Max;
        pIVar7 = local_118;
        local_120 = pcVar5;
        ImVec2::ImVec2(&local_128,0.5,0.5);
        RenderTextClipped((ImVec2 *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                          (char *)in_stack_fffffffffffffe30,pcVar5,pIVar7,pIVar8,
                          in_stack_fffffffffffffe50);
        hide_text_after_hash = (undefined1)((ulong)pcVar5 >> 0x38);
        if (0.0 < local_60.x) {
          ImVec2::ImVec2(&local_130,local_70.Max.x + (local_50->ItemInnerSpacing).x,
                         local_70.Min.y + (local_50->FramePadding).y);
          RenderText(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                     (char *)in_stack_fffffffffffffe30,(bool)hide_text_after_hash);
        }
        local_1 = (bool)(local_d1 & 1);
      }
      else {
        local_a6 = (in_stack_00000008 & 0x10) != 0;
        if (!(bool)local_a6) {
          local_28 = (char *)0x0;
          local_30 = (void *)0x0;
        }
        local_1 = TempInputScalar(local_10,local_54,local_28,
                                  (ImGuiDataType)((ulong)local_28 >> 0x20),local_30,
                                  (char *)CONCAT44(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48),local_20,local_38);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SliderScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const float w = CalcItemWidth();

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    // Tabbing or CTRL-clicking on Slider turns it into an input box
    const bool hovered = ItemHoverable(frame_bb, id);
    const bool temp_input_allowed = (flags & ImGuiSliderFlags_NoInput) == 0;
    bool temp_input_is_active = temp_input_allowed && TempInputIsActive(id);
    if (!temp_input_is_active)
    {
        const bool focus_requested = temp_input_allowed && FocusableItemRegister(window, id);
        const bool clicked = (hovered && g.IO.MouseClicked[0]);
        if (focus_requested || clicked || g.NavActivateId == id || g.NavInputId == id)
        {
            SetActiveID(id, window);
            SetFocusID(id, window);
            FocusWindow(window);
            g.ActiveIdUsingNavDirMask |= (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right);
            if (temp_input_allowed && (focus_requested || (clicked && g.IO.KeyCtrl) || g.NavInputId == id))
            {
                temp_input_is_active = true;
                FocusableItemUnregister(window);
            }
        }
    }

    if (temp_input_is_active)
    {
        // Only clamp CTRL+Click input when ImGuiSliderFlags_AlwaysClamp is set
        const bool is_clamp_input = (flags & ImGuiSliderFlags_AlwaysClamp) != 0;
        return TempInputScalar(frame_bb, id, label, data_type, p_data, format, is_clamp_input ? p_min : NULL, is_clamp_input ? p_max : NULL);
    }

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, g.Style.FrameRounding);

    // Slider behavior
    ImRect grab_bb;
    const bool value_changed = SliderBehavior(frame_bb, id, data_type, p_data, p_min, p_max, format, flags, &grab_bb);
    if (value_changed)
        MarkItemEdited(id);

    // Render grab
    if (grab_bb.Max.x > grab_bb.Min.x)
        window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    RenderTextClipped(frame_bb.Min, frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.5f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags);
    return value_changed;
}